

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineDocumentHelper.cc
# Opt level: O0

void __thiscall QPDFOutlineDocumentHelper::initializeByPage(QPDFOutlineDocumentHelper *this)

{
  bool bVar1;
  element_type *peVar2;
  iterator iVar3;
  iterator iVar4;
  reference pvVar5;
  mapped_type *this_00;
  iterator local_d8;
  const_iterator local_d0;
  undefined1 local_c8 [8];
  vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> kids;
  QPDFObjGen local_a0;
  undefined1 local_98 [8];
  QPDFOutlineObjectHelper oh;
  iterator local_38;
  const_iterator local_30;
  undefined1 local_28 [8];
  list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> queue;
  QPDFOutlineDocumentHelper *this_local;
  
  queue.super__List_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>._M_impl.
  _M_node._M_size = (size_t)this;
  std::__cxx11::list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::list
            ((list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)local_28);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::end
                 ((list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)
                  local_28);
  std::_List_const_iterator<QPDFOutlineObjectHelper>::_List_const_iterator(&local_30,&local_38);
  peVar2 = std::
           __shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m);
  iVar3 = std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::begin
                    (&peVar2->outlines);
  peVar2 = std::
           __shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m);
  iVar4 = std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::end
                    (&peVar2->outlines);
  oh.m.super___shared_ptr<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          std::__cxx11::list<QPDFOutlineObjectHelper,std::allocator<QPDFOutlineObjectHelper>>::
          insert<__gnu_cxx::__normal_iterator<QPDFOutlineObjectHelper*,std::vector<QPDFOutlineObjectHelper,std::allocator<QPDFOutlineObjectHelper>>>,void>
                    ((list<QPDFOutlineObjectHelper,std::allocator<QPDFOutlineObjectHelper>> *)
                     local_28,local_30,
                     (__normal_iterator<QPDFOutlineObjectHelper_*,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>
                      )iVar3._M_current,
                     (__normal_iterator<QPDFOutlineObjectHelper_*,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>
                      )iVar4._M_current);
  while( true ) {
    bVar1 = std::__cxx11::list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::
            empty((list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)
                  local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pvVar5 = std::__cxx11::list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::
             front((list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)
                   local_28);
    QPDFOutlineObjectHelper::QPDFOutlineObjectHelper((QPDFOutlineObjectHelper *)local_98,pvVar5);
    std::__cxx11::list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::pop_front
              ((list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)local_28);
    peVar2 = std::
             __shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m);
    QPDFOutlineObjectHelper::getDestPage
              ((QPDFOutlineObjectHelper *)
               &kids.
                super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_a0 = QPDFObjectHandle::getObjGen
                         ((QPDFObjectHandle *)
                          &kids.
                           super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_00 = std::
              map<QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>_>_>
              ::operator[](&peVar2->by_page,&local_a0);
    std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::push_back
              (this_00,(value_type *)local_98);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &kids.
                super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    QPDFOutlineObjectHelper::getKids
              ((vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)local_c8
               ,(QPDFOutlineObjectHelper *)local_98);
    local_d8._M_node =
         (_List_node_base *)
         std::__cxx11::list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::end
                   ((list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)
                    local_28);
    std::_List_const_iterator<QPDFOutlineObjectHelper>::_List_const_iterator(&local_d0,&local_d8);
    iVar3 = std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::begin
                      ((vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)
                       local_c8);
    iVar4 = std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::end
                      ((vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)
                       local_c8);
    std::__cxx11::list<QPDFOutlineObjectHelper,std::allocator<QPDFOutlineObjectHelper>>::
    insert<__gnu_cxx::__normal_iterator<QPDFOutlineObjectHelper*,std::vector<QPDFOutlineObjectHelper,std::allocator<QPDFOutlineObjectHelper>>>,void>
              ((list<QPDFOutlineObjectHelper,std::allocator<QPDFOutlineObjectHelper>> *)local_28,
               local_d0,(__normal_iterator<QPDFOutlineObjectHelper_*,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>
                         )iVar3._M_current,
               (__normal_iterator<QPDFOutlineObjectHelper_*,_std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>_>
                )iVar4._M_current);
    std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
              ((vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)local_c8
              );
    QPDFOutlineObjectHelper::~QPDFOutlineObjectHelper((QPDFOutlineObjectHelper *)local_98);
  }
  std::__cxx11::list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~list
            ((list<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)local_28);
  return;
}

Assistant:

void
QPDFOutlineDocumentHelper::initializeByPage()
{
    std::list<QPDFOutlineObjectHelper> queue;
    queue.insert(queue.end(), m->outlines.begin(), m->outlines.end());

    while (!queue.empty()) {
        QPDFOutlineObjectHelper oh = queue.front();
        queue.pop_front();
        m->by_page[oh.getDestPage().getObjGen()].push_back(oh);
        std::vector<QPDFOutlineObjectHelper> kids = oh.getKids();
        queue.insert(queue.end(), kids.begin(), kids.end());
    }
}